

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::string_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::hugeint_t> *state,string_t *x,hugeint_t *y,
               AggregateBinaryInput *binary)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int64_t iVar4;
  bool bVar5;
  bool bVar6;
  string_t new_value;
  string_t new_value_00;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    new_value_00.value.pointer.ptr = (char *)binary;
    new_value_00.value._0_8_ = (x->value).pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value_00);
    iVar4 = y->upper;
    (state->value).lower = y->lower;
    (state->value).upper = iVar4;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  else {
    uVar1 = y->lower;
    lVar2 = y->upper;
    lVar3 = (state->value).upper;
    bVar6 = (state->value).lower < uVar1;
    new_value.value._9_7_ = (undefined7)((ulong)binary >> 8);
    bVar5 = bVar6;
    if ((lVar3 < lVar2) || (bVar5 = bVar6 && lVar3 == lVar2, bVar6 && lVar3 == lVar2)) {
      new_value.value.inlined.inlined[4] = bVar5;
      new_value.value._0_8_ = (x->value).pointer.ptr;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
      (state->value).lower = uVar1;
      (state->value).upper = lVar2;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}